

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  ImGuiWindow *pIVar2;
  
  if ((flags & 0x40U) != 0) {
    __assert_fail("(flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1931,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  if ((flags & 4U) != 0) {
    if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
      return false;
    }
    goto LAB_001285a4;
  }
  switch(flags & 3) {
  case 0:
    if (GImGui->HoveredWindow != GImGui->CurrentWindow) {
      return false;
    }
    goto LAB_001285a4;
  case 1:
    pIVar1 = GImGui->HoveredWindow;
    if (pIVar1 == (ImGuiWindow *)0x0) {
      return false;
    }
    if (pIVar1->RootWindow != GImGui->CurrentWindow) {
      while (pIVar1 != GImGui->CurrentWindow) {
        pIVar1 = pIVar1->ParentWindow;
        if (pIVar1 == (ImGuiWindow *)0x0) {
          return false;
        }
      }
    }
    goto LAB_001285a4;
  case 2:
    pIVar1 = GImGui->CurrentWindow;
    pIVar2 = GImGui->HoveredWindow;
    break;
  case 3:
    pIVar1 = GImGui->CurrentWindow;
    pIVar2 = GImGui->HoveredRootWindow;
  }
  if (pIVar2 != pIVar1->RootWindow) {
    return false;
  }
LAB_001285a4:
  if ((((((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar1 = GImGui->NavWindow->RootWindow, pIVar1 == (ImGuiWindow *)0x0)) ||
        (pIVar1->WasActive != true)) || (pIVar1 == GImGui->HoveredWindow->RootWindow)) ||
      ((((uint)pIVar1->Flags >> 0x1b & 1) == 0 &&
       (((flags & 8U) != 0 || ((pIVar1->Flags & 0x4000000U) == 0)))))) &&
     (((flags & 0x20U) != 0 ||
      (((GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap != false)) ||
       (GImGui->ActiveId == GImGui->HoveredWindow->MoveId)))))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredRootWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}